

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.c
# Opt level: O2

int findlabel(LexState *ls,int g)

{
  int iVar1;
  int iVar2;
  Dyndata *pDVar3;
  BlockCnt *pBVar4;
  Labeldesc *pLVar5;
  long lVar6;
  Labeldesc *pLVar7;
  long lVar8;
  long lVar9;
  
  pDVar3 = ls->dyd;
  pBVar4 = ls->fs->bl;
  pLVar7 = (pDVar3->gt).arr + g;
  iVar1 = pBVar4->firstlabel;
  iVar2 = (pDVar3->label).n;
  lVar9 = (long)iVar1 + -1;
  lVar6 = (long)iVar1 * 0x18 + -0x18;
  do {
    lVar8 = lVar6;
    lVar9 = lVar9 + 1;
    if (iVar2 <= lVar9) {
      return 0;
    }
    pLVar5 = (pDVar3->label).arr;
    lVar6 = lVar8 + 0x18;
  } while (*(TString **)((long)&pLVar5[1].name + lVar8) != pLVar7->name);
  if (((&pLVar5[1].nactvar)[lVar8] < pLVar7->nactvar) &&
     ((pBVar4->upval != '\0' || (iVar1 < iVar2)))) {
    luaK_patchclose(ls->fs,pLVar7->pc,(uint)(&pLVar5[1].nactvar)[lVar8]);
  }
  closegoto(ls,g,(Labeldesc *)((long)&pLVar5[1].name + lVar8));
  return 1;
}

Assistant:

static int findlabel (LexState *ls, int g) {
  int i;
  BlockCnt *bl = ls->fs->bl;
  Dyndata *dyd = ls->dyd;
  Labeldesc *gt = &dyd->gt.arr[g];
  /* check labels in current block for a match */
  for (i = bl->firstlabel; i < dyd->label.n; i++) {
    Labeldesc *lb = &dyd->label.arr[i];
    if (eqstr(lb->name, gt->name)) {  /* correct label? */
      if (gt->nactvar > lb->nactvar &&
          (bl->upval || dyd->label.n > bl->firstlabel))
        luaK_patchclose(ls->fs, gt->pc, lb->nactvar);
      closegoto(ls, g, lb);  /* close it */
      return 1;
    }
  }
  return 0;  /* label not found; cannot close goto */
}